

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_ldrddi.cpp
# Opt level: O0

ze_result_t
loader::zeEventPoolPutIpcHandle(ze_context_handle_t hContext,ze_ipc_event_pool_handle_t hIpc)

{
  code *pcVar1;
  undefined8 uVar2;
  undefined1 local_70 [64];
  code *local_30;
  ze_pfnEventPoolPutIpcHandle_t pfnPutIpcHandle;
  dditable_t *dditable;
  undefined8 uStack_18;
  ze_result_t result;
  ze_context_handle_t hContext_local;
  
  dditable._4_4_ = 0;
  pfnPutIpcHandle = *(ze_pfnEventPoolPutIpcHandle_t *)(hContext + 8);
  pcVar1 = *(code **)(pfnPutIpcHandle + 0x480);
  if (pcVar1 == (code *)0x0) {
    hContext_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    uVar2 = *(undefined8 *)hContext;
    local_30 = pcVar1;
    uStack_18 = uVar2;
    memcpy(local_70,&hIpc,0x40);
    hContext_local._4_4_ = (*pcVar1)(uVar2);
  }
  return hContext_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeEventPoolPutIpcHandle(
        ze_context_handle_t hContext,                   ///< [in] handle of the context object associated with the IPC event pool
                                                        ///< handle
        ze_ipc_event_pool_handle_t hIpc                 ///< [in] IPC event pool handle
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<ze_context_object_t*>( hContext )->dditable;
        auto pfnPutIpcHandle = dditable->ze.EventPool.pfnPutIpcHandle;
        if( nullptr == pfnPutIpcHandle )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hContext = reinterpret_cast<ze_context_object_t*>( hContext )->handle;

        // forward to device-driver
        result = pfnPutIpcHandle( hContext, hIpc );

        return result;
    }